

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlParseLookupCommentEnd(htmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  int local_1c;
  int cur;
  int mark;
  htmlParserCtxtPtr ctxt_local;
  
  local_1c = 0;
  pxVar1 = ctxt->input->cur;
  pxVar2 = ctxt->input->base;
  while( true ) {
    if (local_1c < 0) {
      return local_1c;
    }
    local_1c = htmlParseLookupSequence(ctxt,'-','-','\0',0);
    if (local_1c < 0) {
      return local_1c;
    }
    if (ctxt->input->cur[local_1c + 2] == '>') {
      return local_1c;
    }
    if ((ctxt->input->cur[local_1c + 2] == '!') && (ctxt->input->cur[local_1c + 3] == '>')) break;
    ctxt->checkIndex = (long)(((int)pxVar1 - (int)pxVar2) + local_1c + 1);
  }
  return local_1c;
}

Assistant:

static int
htmlParseLookupCommentEnd(htmlParserCtxtPtr ctxt)
{
    int mark = 0;
    int cur = CUR_PTR - BASE_PTR;

    while (mark >= 0) {
	mark = htmlParseLookupSequence(ctxt, '-', '-', 0, 0);
	if ((mark < 0) ||
	    (NXT(mark+2) == '>') ||
	    ((NXT(mark+2) == '!') && (NXT(mark+3) == '>'))) {
	    return mark;
	}
	ctxt->checkIndex = cur + mark + 1;
    }
    return mark;
}